

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col,float rounding,ImDrawFlags flags)

{
  int iVar1;
  uint flags_00;
  
  if (0xffffff < col) {
    if (flags == -1) {
      flags_00 = 0xf0;
    }
    else if (flags - 1U < 0xf) {
      flags_00 = flags << 4;
    }
    else {
      if ((flags & 0xfU) != 0) {
        __assert_fail("(flags & 0x0F) == 0 && \"Misuse of legacy hardcoded ImDrawCornerFlags values!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0x545,"ImDrawFlags FixRectCornerFlags(ImDrawFlags)");
      }
      flags_00 = flags | 0xf0;
      if ((flags & 0x1f0U) != 0) {
        flags_00 = flags;
      }
    }
    if ((rounding <= 0.0) || ((flags_00 & 0x1f0) == 0x100)) {
      AddImage(this,user_texture_id,p_min,p_max,uv_min,uv_max,col);
    }
    else {
      if ((this->_CmdHeader).TextureId != user_texture_id) {
        PushTextureID(this,user_texture_id);
        iVar1 = (this->VtxBuffer).Size;
        PathRect(this,p_min,p_max,rounding,flags_00);
        AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
        (this->_Path).Size = 0;
        ImGui::ShadeVertsLinearUV(this,iVar1,(this->VtxBuffer).Size,p_min,p_max,uv_min,uv_max,true);
        PopTextureID(this);
        return;
      }
      iVar1 = (this->VtxBuffer).Size;
      PathRect(this,p_min,p_max,rounding,flags_00);
      AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
      (this->_Path).Size = 0;
      ImGui::ShadeVertsLinearUV(this,iVar1,(this->VtxBuffer).Size,p_min,p_max,uv_min,uv_max,true);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col, float rounding, ImDrawFlags flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    flags = FixRectCornerFlags(flags);
    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        AddImage(user_texture_id, p_min, p_max, uv_min, uv_max, col);
        return;
    }

    const bool push_texture_id = user_texture_id != _CmdHeader.TextureId;
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(p_min, p_max, rounding, flags);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(this, vert_start_idx, vert_end_idx, p_min, p_max, uv_min, uv_max, true);

    if (push_texture_id)
        PopTextureID();
}